

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O3

void __thiscall Imf_3_4::DeepScanLineInputFile::Data::Data(Data *this,Context *ctxt,int pN,int nT)

{
  _Rb_tree_header *p_Var1;
  undefined1 in_R10B;
  V2f local_20;
  
  this->_ctxt = ctxt;
  this->partNumber = pN;
  this->numThreads = nT;
  local_20.x = 0.0;
  local_20.y = 0.0;
  Header::Header(&this->header,0x40,0x40,1.0,&local_20,1.0,INCREASING_Y,ZIP_COMPRESSION);
  this->header_filled = false;
  this->frameBufferValid = false;
  p_Var1 = &(this->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header;
  (this->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  Slice::Slice(&(this->frameBuffer)._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,(bool)in_R10B,
               SUB81(p_Var1,0));
  (this->_mx).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->_mx).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->_mx).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->_mx).super___mutex_base._M_mutex + 0x10) = 0;
  (this->fill_list).super__Vector_base<Imf_3_4::DeepSlice,_std::allocator<Imf_3_4::DeepSlice>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_mx).super___mutex_base._M_mutex.__align = 0;
  (this->fill_list).super__Vector_base<Imf_3_4::DeepSlice,_std::allocator<Imf_3_4::DeepSlice>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->fill_list).super__Vector_base<Imf_3_4::DeepSlice,_std::allocator<Imf_3_4::DeepSlice>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

Data (Context *ctxt, int pN, int nT)
    : _ctxt (ctxt)
    , partNumber (pN)
    , numThreads (nT)
    {}